

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_ApproximateOffsetOfPlain::_Run(_Test_ApproximateOffsetOfPlain *this)

{
  Env **ppEVar1;
  bool bVar2;
  uint64_t uVar3;
  Slice local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  TableConstructor c;
  Options options;
  KVMap kvmap;
  Tester local_1d0;
  
  c.super_Constructor.data_._M_t._M_impl.
  super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>._M_key_compare.cmp =
       (STLLessThan)BytewiseComparator();
  c.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header;
  c.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c.super_Constructor._vptr_Constructor = (_func_int **)&PTR__TableConstructor_0013bde0;
  c.source_ = (StringSource *)0x0;
  c.table_ = (Table *)0x0;
  c.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c.super_Constructor.data_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_1d0,"k01",(allocator *)&kvmap);
  options.comparator = (Comparator *)anon_var_dwarf_febe;
  options.create_if_missing = true;
  options.error_if_exists = false;
  options.paranoid_checks = false;
  options._11_5_ = 0;
  Constructor::Add(&c.super_Constructor,(string *)&local_1d0,(Slice *)&options);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1d0,"k02",(allocator *)&kvmap);
  options.comparator = (Comparator *)anon_var_dwarf_fed6;
  options.create_if_missing = true;
  options.error_if_exists = false;
  options.paranoid_checks = false;
  options._11_5_ = 0;
  Constructor::Add(&c.super_Constructor,(string *)&local_1d0,(Slice *)&options);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1d0,"k03",(allocator *)&keys);
  ppEVar1 = &options.env;
  options.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct((ulong)&options,'\x10');
  kvmap._M_t._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)(STLLessThan)options.comparator;
  kvmap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = options._8_8_;
  Constructor::Add(&c.super_Constructor,(string *)&local_1d0,(Slice *)&kvmap);
  std::__cxx11::string::~string((string *)&options);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1d0,"k04",(allocator *)&keys);
  options.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct((ulong)&options,'@');
  kvmap._M_t._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)(STLLessThan)options.comparator;
  kvmap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = options._8_8_;
  Constructor::Add(&c.super_Constructor,(string *)&local_1d0,(Slice *)&kvmap);
  std::__cxx11::string::~string((string *)&options);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1d0,"k05",(allocator *)&keys);
  options.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct((ulong)&options,-0x20);
  kvmap._M_t._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)(STLLessThan)options.comparator;
  kvmap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = options._8_8_;
  Constructor::Add(&c.super_Constructor,(string *)&local_1d0,(Slice *)&kvmap);
  std::__cxx11::string::~string((string *)&options);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1d0,"k06",(allocator *)&kvmap);
  options.comparator = (Comparator *)anon_var_dwarf_ff12;
  options.create_if_missing = true;
  options.error_if_exists = false;
  options.paranoid_checks = false;
  options._11_5_ = 0;
  Constructor::Add(&c.super_Constructor,(string *)&local_1d0,(Slice *)&options);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1d0,"k07",(allocator *)&keys);
  options.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct((ulong)&options,-0x60);
  kvmap._M_t._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)(STLLessThan)options.comparator;
  kvmap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = options._8_8_;
  Constructor::Add(&c.super_Constructor,(string *)&local_1d0,(Slice *)&kvmap);
  std::__cxx11::string::~string((string *)&options);
  std::__cxx11::string::~string((string *)&local_1d0);
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  kvmap._M_t._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)BytewiseComparator();
  kvmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &kvmap._M_t._M_impl.super__Rb_tree_header._M_header;
  kvmap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       kvmap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  kvmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  kvmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  kvmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       kvmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Options::Options(&options);
  options.block_size = 0x400;
  options.compression = kNoCompression;
  Constructor::Finish(&c.super_Constructor,&options,&keys,&kvmap);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30a);
  local_2d8.data_ = "abc";
  local_2d8.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,0,0);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"abc\"), 0, 0)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30b);
  local_2d8.data_ = "k01";
  local_2d8.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,0,0);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"k01\"), 0, 0)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30c);
  local_2d8.data_ = "k01a";
  local_2d8.size_ = 4;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,0,0);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"k01a\"), 0, 0)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30d);
  local_2d8.data_ = "k02";
  local_2d8.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,0,0);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"k02\"), 0, 0)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30e);
  local_2d8.data_ = "k03";
  local_2d8.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,0,0);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"k03\"), 0, 0)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30f);
  local_2d8.data_ = "k04";
  local_2d8.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,10000,11000);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"k04\"), 10000, 11000)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x310);
  local_2d8.data_ = "k04a";
  local_2d8.size_ = 4;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,210000,0x33838);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"k04a\"), 210000, 211000)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x311);
  local_2d8.data_ = "k05";
  local_2d8.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,210000,0x33838);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"k05\"), 210000, 211000)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x312);
  local_2d8.data_ = "k06";
  local_2d8.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,510000,0x7cc18);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"k06\"), 510000, 511000)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x313);
  local_2d8.data_ = "k07";
  local_2d8.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,510000,0x7cc18);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"k07\"), 510000, 511000)");
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x314);
  local_2d8.data_ = "xyz";
  local_2d8.size_ = 3;
  uVar3 = Table::ApproximateOffsetOf(c.table_,&local_2d8);
  bVar2 = Between(uVar3,610000,0x956a0);
  test::Tester::Is(&local_1d0,bVar2,"Between(c.ApproximateOffsetOf(\"xyz\"), 610000, 612000)");
  test::Tester::~Tester(&local_1d0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&kvmap);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&keys);
  TableConstructor::~TableConstructor(&c);
  return;
}

Assistant:

TEST(TableTest, ApproximateOffsetOfPlain) {
  TableConstructor c(BytewiseComparator());
  c.Add("k01", "hello");
  c.Add("k02", "hello2");
  c.Add("k03", std::string(10000, 'x'));
  c.Add("k04", std::string(200000, 'x'));
  c.Add("k05", std::string(300000, 'x'));
  c.Add("k06", "hello3");
  c.Add("k07", std::string(100000, 'x'));
  std::vector<std::string> keys;
  KVMap kvmap;
  Options options;
  options.block_size = 1024;
  options.compression = kNoCompression;
  c.Finish(options, &keys, &kvmap);

  ASSERT_TRUE(Between(c.ApproximateOffsetOf("abc"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k01"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k01a"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k02"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k03"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k04"), 10000, 11000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k04a"), 210000, 211000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k05"), 210000, 211000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k06"), 510000, 511000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k07"), 510000, 511000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("xyz"), 610000, 612000));
}